

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O2

void __thiscall
MADPComponentDiscreteStates::MADPComponentDiscreteStates
          (MADPComponentDiscreteStates *this,MADPComponentDiscreteStates *a)

{
  StateDistributionVector *this_00;
  
  this->_vptr_MADPComponentDiscreteStates = (_func_int **)&PTR__MADPComponentDiscreteStates_00610d40
  ;
  (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_m_stateVec).super__Vector_base<StateDiscrete,_std::allocator<StateDiscrete>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_m_initialized = a->_m_initialized;
  this->_m_nrStates = a->_m_nrStates;
  std::vector<StateDiscrete,_std::allocator<StateDiscrete>_>::operator=
            (&this->_m_stateVec,&a->_m_stateVec);
  this_00 = (StateDistributionVector *)operator_new(0x20);
  StateDistributionVector::StateDistributionVector(this_00,a->_m_initialStateDistribution);
  this->_m_initialStateDistribution = this_00;
  return;
}

Assistant:

MADPComponentDiscreteStates::MADPComponentDiscreteStates(
    const MADPComponentDiscreteStates& a)
{
    _m_initialized=a._m_initialized;
    _m_nrStates=a._m_nrStates;
    _m_stateVec=a._m_stateVec;
    _m_initialStateDistribution=
        new StateDistributionVector(*a._m_initialStateDistribution);
}